

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjRelease(jx9_value *pObj)

{
  uint uVar1;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 0x20) == 0) {
    if ((uVar1 & 0x40) != 0) {
      jx9HashmapUnref((jx9_hashmap *)(pObj->x).pOther);
    }
    uVar1 = SyBlobRelease(&pObj->sBlob);
    pObj->iFlags = 0x20;
  }
  return uVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjRelease(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_NULL) == 0 ){
		if( pObj->iFlags & MEMOBJ_HASHMAP ){
			jx9HashmapUnref((jx9_hashmap *)pObj->x.pOther);
		}
		/* Release the internal buffer */
		SyBlobRelease(&pObj->sBlob);
		/* Invalidate any prior representation */
		pObj->iFlags = MEMOBJ_NULL;
	}
	return SXRET_OK;
}